

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMarkers::IntLoadResidual_F(ChLinkMarkers *this,uint off,ChVectorDynamic<> *R,double c)

{
  ChBodyFrame *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  double c_local;
  Vector mbody_torque;
  StorageBaseType *local_f0 [2];
  Vector m_abs_force;
  Vector mbody_force;
  ChVector<double> local_b0;
  ChVector<double> local_98 [2];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_60;
  
  if (((this->super_ChLink).Body1 != (ChBodyFrame *)0x0) &&
     ((this->super_ChLink).Body2 != (ChBodyFrame *)0x0)) {
    mbody_force.m_data[2] = 0.0;
    mbody_torque.m_data[2] = 0.0;
    mbody_force.m_data[0] = 0.0;
    mbody_force.m_data[1] = 0.0;
    mbody_torque.m_data[0] = 0.0;
    mbody_torque.m_data[1] = 0.0;
    c_local = c;
    bVar2 = Vnotnull<double>(&this->C_force);
    if (bVar2) {
      pCVar1 = (this->super_ChLink).Body2;
      ChMatrix33<double>::operator*
                (&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,
                 &this->C_force);
      ChMatrix33<double>::operator*
                (&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,local_98);
      iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      if (*(char *)(CONCAT44(extraout_var,iVar3) + 0x2c) == '\0') {
        ChBodyFrame::To_abs_forcetorque
                  ((this->super_ChLink).Body2,&m_abs_force,
                   &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&mbody_force,
                   &mbody_torque);
        local_b0.m_data[0] = (double)&mbody_force;
        Eigen::operator*(&local_60,&c_local,(StorageBaseType *)&local_b0);
        iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  _vptr_ChFrame[0x10])();
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_98,R,
                   (long)*(int *)(CONCAT44(extraout_var_00,iVar3) + 0x30),3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   local_98,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)&local_60);
        ChFrame<double>::TransformDirectionParentToLocal
                  (&local_b0,(ChFrame<double> *)(this->super_ChLink).Body2,&mbody_torque);
        local_f0[0] = (StorageBaseType *)&local_b0;
        Eigen::operator*(&local_60,&c_local,(StorageBaseType *)local_f0);
        iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  _vptr_ChFrame[0x10])();
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_98,R,
                   (long)*(int *)(CONCAT44(extraout_var_01,iVar3) + 0x30) + 3,3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   local_98,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)&local_60);
      }
      iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      if (*(char *)(CONCAT44(extraout_var_02,iVar3) + 0x2c) == '\0') {
        ChBodyFrame::To_abs_forcetorque
                  ((this->super_ChLink).Body1,&m_abs_force,
                   &(this->marker1->abs_frame).super_ChFrame<double>.coord.pos,false,&mbody_force,
                   &mbody_torque);
        local_b0.m_data[0] = (double)&mbody_force;
        Eigen::operator*(&local_60,&c_local,(StorageBaseType *)&local_b0);
        iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  _vptr_ChFrame[0x10])();
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_98,R,
                   (long)*(int *)(CONCAT44(extraout_var_03,iVar3) + 0x30),3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   local_98,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)&local_60);
        ChFrame<double>::TransformDirectionParentToLocal
                  (&local_b0,(ChFrame<double> *)(this->super_ChLink).Body1,&mbody_torque);
        local_f0[0] = (StorageBaseType *)&local_b0;
        Eigen::operator*(&local_60,&c_local,(StorageBaseType *)local_f0);
        iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  _vptr_ChFrame[0x10])();
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_98,R,
                   (long)*(int *)(CONCAT44(extraout_var_04,iVar3) + 0x30) + 3,3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   local_98,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)&local_60);
      }
    }
    bVar2 = Vnotnull<double>(&this->C_torque);
    if (bVar2) {
      pCVar1 = (this->super_ChLink).Body2;
      ChMatrix33<double>::operator*
                (&(this->marker2->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,
                 &this->C_torque);
      ChMatrix33<double>::operator*
                (&(pCVar1->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix,local_98);
      iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      if (*(char *)(CONCAT44(extraout_var_05,iVar3) + 0x2c) == '\0') {
        ChFrame<double>::TransformDirectionParentToLocal
                  (&local_b0,(ChFrame<double> *)(this->super_ChLink).Body1,&m_abs_force);
        local_f0[0] = (StorageBaseType *)&local_b0;
        Eigen::operator*(&local_60,&c_local,(StorageBaseType *)local_f0);
        iVar3 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  _vptr_ChFrame[0x10])();
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_98,R,
                   (long)*(int *)(CONCAT44(extraout_var_06,iVar3) + 0x30) + 3,3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator+=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   local_98,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)&local_60);
      }
      iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                _vptr_ChFrame[0x10])();
      if (*(char *)(CONCAT44(extraout_var_07,iVar3) + 0x2c) == '\0') {
        ChFrame<double>::TransformDirectionParentToLocal
                  (&local_b0,(ChFrame<double> *)(this->super_ChLink).Body2,&m_abs_force);
        local_f0[0] = (StorageBaseType *)&local_b0;
        Eigen::operator*(&local_60,&c_local,(StorageBaseType *)local_f0);
        iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  _vptr_ChFrame[0x10])();
        Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
                  ((VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_98,R,
                   (long)*(int *)(CONCAT44(extraout_var_08,iVar3) + 0x30) + 3,3);
        Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>::operator-=
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>> *)
                   local_98,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                             *)&local_60);
      }
    }
  }
  return;
}

Assistant:

void ChLinkMarkers::IntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    if (!Body1 || !Body2)
        return;

    Vector mbody_force;
    Vector mbody_torque;
    if (Vnotnull(C_force)) {
        Vector m_abs_force = Body2->GetA() * (marker2->GetA() * C_force);

        if (Body2->Variables().IsActive()) {
            Body2->To_abs_forcetorque(m_abs_force,
                                      marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                      false,                       // from abs. space
                                      mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
            R.segment(Body2->Variables().GetOffset() + 0, 3) -= c * mbody_force.eigen();
            R.segment(Body2->Variables().GetOffset() + 3, 3) -=
                c * Body2->TransformDirectionParentToLocal(mbody_torque).eigen();
        }

        if (Body1->Variables().IsActive()) {
            Body1->To_abs_forcetorque(m_abs_force,
                                      marker1->GetAbsCoord().pos,  // absolute application point is always marker1
                                      false,                       // from abs. space
                                      mbody_force, mbody_torque);  // resulting force-torque, both in abs coords
            R.segment(Body1->Variables().GetOffset() + 0, 3) += c * mbody_force.eigen();
            R.segment(Body1->Variables().GetOffset() + 3, 3) +=
                c * Body1->TransformDirectionParentToLocal(mbody_torque).eigen();
        }
    }
    if (Vnotnull(C_torque)) {
        Vector m_abs_torque = Body2->GetA() * (marker2->GetA() * C_torque);
        // load torques in 'fb' vector accumulator of body variables (torques in local coords)
        if (Body1->Variables().IsActive()) {
            R.segment(Body1->Variables().GetOffset() + 3, 3) +=
                c * Body1->TransformDirectionParentToLocal(m_abs_torque).eigen();
        }
        if (Body2->Variables().IsActive()) {
            R.segment(Body2->Variables().GetOffset() + 3, 3) -=
                c * Body2->TransformDirectionParentToLocal(m_abs_torque).eigen();
        }
    }
}